

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QWindow * __thiscall QWidgetPrivate::windowHandle(QWidgetPrivate *this,WindowHandleMode mode)

{
  QTLWExtra *pQVar1;
  QWidget *pQVar2;
  QWindow *pQVar3;
  int in_ESI;
  QWidgetPrivate *in_RDI;
  QWindow *window_1;
  QWidget *topLevel;
  QWindow *window;
  QWidget *nativeParent;
  QTLWExtra *x;
  QWidgetPrivate *in_stack_ffffffffffffffc0;
  QWidgetWindow *local_8;
  
  if ((((in_ESI == 0) || (in_ESI == 1)) &&
      (pQVar1 = maybeTopData(in_stack_ffffffffffffffc0), pQVar1 != (QTLWExtra *)0x0)) &&
     ((pQVar1->window != (QWidgetWindow *)0x0 || (in_ESI == 0)))) {
    local_8 = pQVar1->window;
  }
  else {
    if (in_ESI == 1) {
      q_func(in_RDI);
      pQVar2 = QWidget::nativeParentWidget((QWidget *)in_stack_ffffffffffffffc0);
      if ((pQVar2 != (QWidget *)0x0) &&
         (pQVar3 = QWidget::windowHandle((QWidget *)in_stack_ffffffffffffffc0),
         pQVar3 != (QWindow *)0x0)) {
        return pQVar3;
      }
    }
    if ((in_ESI == 2) || (in_ESI == 1)) {
      q_func(in_RDI);
      pQVar2 = QWidget::topLevelWidget((QWidget *)0x35e5e3);
      if ((pQVar2 != (QWidget *)0x0) &&
         (pQVar3 = QWidget::windowHandle((QWidget *)in_stack_ffffffffffffffc0),
         pQVar3 != (QWindow *)0x0)) {
        return pQVar3;
      }
    }
    local_8 = (QWidgetWindow *)0x0;
  }
  return &local_8->super_QWindow;
}

Assistant:

QWindow *QWidgetPrivate::windowHandle(WindowHandleMode mode) const
{
    if (mode == WindowHandleMode::Direct || mode == WindowHandleMode::Closest) {
        if (QTLWExtra *x = maybeTopData()) {
            if (x->window != nullptr || mode == WindowHandleMode::Direct)
                return x->window;
        }
    }
    if (mode == WindowHandleMode::Closest) {
        // FIXME: Use closestParentWidgetWithWindowHandle instead
        if (auto nativeParent = q_func()->nativeParentWidget()) {
            if (auto window = nativeParent->windowHandle())
                return window;
        }
    }
    if (mode == WindowHandleMode::TopLevel || mode == WindowHandleMode::Closest) {
        if (auto topLevel = q_func()->topLevelWidget()) {
            if (auto window = topLevel ->windowHandle())
                return window;
        }
    }
    return nullptr;
}